

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

TidyDocImpl * tidyDocCreate(TidyAllocator *allocator)

{
  Bool BVar1;
  TidyDocImpl *doc;
  char *pcVar2;
  StreamOut *pSVar3;
  
  doc = (TidyDocImpl *)(*allocator->vtbl->alloc)(allocator,0x3490);
  memset(doc,0,0x3490);
  doc->allocator = allocator;
  prvTidyInitMap();
  prvTidyInitTags(doc);
  prvTidyInitAttrs(doc);
  prvTidyInitConfig(doc);
  prvTidyInitPrintBuf(doc);
  BVar1 = prvTidytidyGetLanguageSetByUser();
  if (BVar1 == no) {
    pcVar2 = getenv("LC_MESSAGES");
    BVar1 = prvTidytidySetLanguage(pcVar2);
    if (BVar1 == no) {
      pcVar2 = getenv("LANG");
      prvTidytidySetLanguage(pcVar2);
    }
  }
  pSVar3 = prvTidyStdErrOutput();
  doc->errout = pSVar3;
  return doc;
}

Assistant:

TidyDocImpl* tidyDocCreate( TidyAllocator *allocator )
{
    TidyDocImpl* doc = (TidyDocImpl*)TidyAlloc( allocator, sizeof(TidyDocImpl) );
    TidyClearMemory( doc, sizeof(*doc) );
    doc->allocator = allocator;

    TY_(InitMap)();
    TY_(InitTags)( doc );
    TY_(InitAttrs)( doc );
    TY_(InitConfig)( doc );
    TY_(InitPrintBuf)( doc );

    /* Set the locale for tidy's output. This both configures
    ** LibTidy to use the environment's locale as well as the
    ** standard library.
    */
#if SUPPORT_LOCALIZATIONS
    if ( TY_(tidyGetLanguageSetByUser)() == no )
    {
        if( ! TY_(tidySetLanguage)( getenv( "LC_MESSAGES" ) ) )
        {
            if( ! TY_(tidySetLanguage)( getenv( "LANG" ) ) )
            {
                /*\
                *  Is. #770 #783 #780 #790 and maybe others -
                *  TY_(tidySetLanguage)( setlocale( LC_ALL, "" ) );
                *  this seems a 'bad' choice!
               \*/
            }
        }
    }
#endif

    /* By default, wire tidy messages to standard error.
    ** Document input will be set by parsing routines.
    ** Document output will be set by pretty print routines.
    ** Config input will be set by config parsing routines.
    ** But we need to start off with a way to report errors.
    */
    doc->errout = TY_(StdErrOutput)();
    return doc;
}